

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::mouseReleaseEvent(QLineEdit *this,QMouseEvent *e)

{
  byte bVar1;
  QLineEditPrivate *this_00;
  QWidgetData *pQVar2;
  QWidget *this_01;
  bool bVar3;
  char cVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  QStyle *pQVar8;
  EVP_PKEY_CTX *src;
  ulong uVar9;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar10 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar11 [16];
  ulong local_40;
  QPoint local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  bVar3 = QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  if (!bVar3) {
    if ((*(int *)(e + 0x40) == 1) && ((this_00->dndTimer).m_id != Invalid)) {
      QBasicTimer::stop();
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QWidgetLineControl::deselect
                  (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
        return;
      }
      goto LAB_0042197a;
    }
    QGuiApplication::clipboard();
    cVar4 = QClipboard::supportsSelection();
    if (cVar4 != '\0') {
      if (*(int *)(e + 0x40) == 1) {
        QWidgetLineControl::copy((QWidgetLineControl *)this_00->control,(EVP_PKEY_CTX *)0x1,src);
      }
      else if ((*(int *)(e + 0x40) == 4) && ((*(ushort *)&this_00->control->field_0x50 & 4) == 0)) {
        QWidgetLineControl::deselect
                  (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
        QWidgetLineControl::paste((QWidgetLineControl *)this_00->control,Selection);
      }
    }
    if ((*(ushort *)(*(long *)(*(long *)&(this->super_QWidget).field_0x8 + 600) + 0x50) & 4) == 0) {
      pQVar2 = (this->super_QWidget).data;
      local_30 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                          (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
      local_38.xp.m_i = 0;
      local_38.yp.m_i = 0;
      uVar5 = QEventPoint::position();
      auVar11._0_8_ =
           (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
      auVar11._8_8_ =
           (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM0_Qa;
      auVar11 = minpd(_DAT_0066f5d0,auVar11);
      auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
      auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
      uVar6 = movmskpd(uVar5,auVar10);
      uVar9 = 0x8000000000000000;
      if ((uVar6 & 1) != 0) {
        uVar9 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
      }
      local_40 = 0x80000000;
      if ((uVar6 & 2) != 0) {
        local_40 = (ulong)(uint)(int)auVar11._8_8_;
      }
      local_40 = local_40 | uVar9;
      cVar4 = QRect::contains(&local_38,SUB81(&local_40,0));
      if ((cVar4 != '\0') && (*(int *)(e + 0x40) == 1)) {
        bVar1 = this_00->field_0x27c;
        this_01 = *(QWidget **)&(this_00->super_QWidgetPrivate).field_0x8;
        bVar3 = QApplication::autoSipEnabled(QCoreApplication::self);
        if (bVar3) {
          pQVar8 = QWidget::style(this_01);
          iVar7 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x5f,0,this_01,0);
          if (((bVar1 & 0x10) == 0) || (iVar7 == 1)) {
            QGuiApplication::inputMethod();
            QInputMethod::show();
          }
        }
      }
    }
    this_00->field_0x27c = this_00->field_0x27c & 0xef;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0042197a:
  __stack_chk_fail();
}

Assistant:

void QLineEdit::mouseReleaseEvent(QMouseEvent* e)
{
    Q_D(QLineEdit);
    if (d->sendMouseEventToInputContext(e))
        return;
#if QT_CONFIG(draganddrop)
    if (e->button() == Qt::LeftButton) {
        if (d->dndTimer.isActive()) {
            d->dndTimer.stop();
            deselect();
            return;
        }
    }
#endif
#ifndef QT_NO_CLIPBOARD
    if (QGuiApplication::clipboard()->supportsSelection()) {
        if (e->button() == Qt::LeftButton) {
            d->control->copy(QClipboard::Selection);
        } else if (!d->control->isReadOnly() && e->button() == Qt::MiddleButton) {
            deselect();
            d->control->paste(QClipboard::Selection);
        }
    }
#endif

    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}